

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  uint uVar8;
  int iVar9;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i_64_t B_4;
  undefined1 auVar39 [16];
  __m128i_64_t B_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i_64_t B_5;
  __m128i_64_t B;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar50;
  __m128i_64_t B_2;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  long lVar53;
  int64_t *local_140;
  undefined1 local_138 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  ulong uStack_f0;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  long local_b8;
  long lStack_b0;
  undefined1 local_a8 [16];
  ulong local_98;
  long local_90;
  int *local_88;
  ulong local_80;
  undefined1 local_78 [16];
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ulong local_48;
  undefined8 uStack_40;
  int64_t iVar10;
  long lVar21;
  long lVar30;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_sse41_128_64_cold_7();
  }
  else {
    uVar20 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_table_diag_sse41_128_64_cold_6();
    }
    else if (open < 0) {
      parasail_sw_table_diag_sse41_128_64_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_table_diag_sse41_128_64_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_table_diag_sse41_128_64_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_table_diag_sse41_128_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_table_diag_sse41_128_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar6 = matrix->min;
      uVar2 = (ulong)(uint)open;
      uVar13 = 0x8000000000000000 - (long)iVar6;
      if (iVar6 != -open && SBORROW4(iVar6,-open) == iVar6 + open < 0) {
        uVar13 = uVar2 | 0x8000000000000000;
      }
      lVar17 = uVar13 + 1;
      local_b8 = (long)matrix->max;
      auVar22._8_4_ = (int)lVar17;
      auVar22._0_8_ = lVar17;
      auVar22._12_4_ = (int)((ulong)lVar17 >> 0x20);
      local_d8 = auVar22;
      local_a8 = auVar22;
      local_78 = auVar22;
      ppVar7 = parasail_result_new_table1(_s1Len,s2Len);
      if (ppVar7 != (parasail_result_t *)0x0) {
        local_c8._0_4_ = gap;
        ppVar7->flag = ppVar7->flag | 0x2821004;
        uVar15 = (ulong)(s2Len + 2);
        ptr = parasail_memalign_int64_t(0x10,uVar15);
        ptr_00 = parasail_memalign_int64_t(0x10,uVar15);
        ptr_01 = parasail_memalign_int64_t(0x10,uVar15);
        if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
          local_98 = uVar13;
          lVar19 = (long)_s1Len;
          if (matrix->type == 0) {
            local_140 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
            if (local_140 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar1 = matrix->mapper;
              lVar18 = 0;
              do {
                local_140[lVar18] = (long)piVar1[(byte)_s1[lVar18]];
                lVar18 = lVar18 + 1;
              } while (lVar19 != lVar18);
            }
            local_140[lVar19] = 0;
          }
          else {
            local_140 = (int64_t *)0x0;
          }
          lVar18 = 0x7ffffffffffffffe - local_b8;
          uVar34 = (undefined4)((ulong)lVar18 >> 0x20);
          local_108._8_4_ = (int)lVar18;
          local_108._0_8_ = lVar18;
          local_108._12_4_ = uVar34;
          uStack_f0 = auVar22._8_8_;
          local_48 = uStack_f0;
          uStack_40 = 0;
          uVar4 = local_c8._0_4_;
          piVar1 = matrix->mapper;
          uVar13 = 0;
          do {
            ptr[uVar13 + 1] = (long)piVar1[(byte)_s2[uVar13]];
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
          uVar13 = 0;
          *ptr = 0;
          ptr[uVar20 + 1] = 0;
          do {
            ptr_00[uVar13 + 1] = 0;
            ptr_01[uVar13 + 1] = lVar17;
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
          *ptr_00 = lVar17;
          *ptr_01 = lVar17;
          ptr_00[uVar20 + 1] = lVar17;
          ptr_01[uVar20 + 1] = lVar17;
          local_d8 = auVar22;
          if (0 < _s1Len) {
            local_68 = lVar18;
            uStack_60 = 0;
            local_88 = matrix->matrix;
            auVar23._4_4_ = _s1Len;
            auVar23._0_4_ = _s1Len;
            auVar23._8_8_ = 0;
            local_58 = pmovzxdq(auVar23,auVar23);
            auVar28 = local_58;
            auVar35._4_4_ = s2Len;
            auVar35._0_4_ = s2Len;
            auVar35._8_8_ = 0;
            local_c8 = pmovzxdq(auVar35,auVar35);
            auVar23 = local_c8;
            local_e0 = uVar20 * 4 + -4;
            local_90 = uVar20 * 8;
            local_138 = pmovsxbq(local_c8,1);
            lVar16 = 0;
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            uVar13 = 0;
            local_78 = auVar22;
            local_a8 = auVar22;
            local_118 = auVar22;
            do {
              if (matrix->type == 0) {
                uVar15 = local_140[uVar13];
                iVar10 = local_140[uVar13 + 1];
              }
              else {
                uVar8 = (uint)uVar13 | 1;
                if (lVar19 <= (long)(uVar13 | 1)) {
                  uVar8 = _s1Len - 1;
                }
                iVar10 = (int64_t)(int)uVar8;
                uVar15 = uVar13;
              }
              iVar6 = matrix->size;
              local_80 = uVar13;
              local_b8 = -(ulong)((long)local_138._0_8_ < (long)local_58._0_8_);
              lStack_b0 = -(ulong)((long)local_138._8_8_ < (long)local_58._8_8_);
              uVar11 = 0;
              in_XMM6 = pmovsxbq(in_XMM6,0xff);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uStack_f0;
              auVar35 = auVar22;
              auVar49 = auVar22;
              auVar52 = auVar42;
              do {
                auVar31._0_8_ = (long)local_88[iVar10 * iVar6 + ptr[uVar11]] + auVar42._0_8_;
                auVar31._8_8_ =
                     (long)local_88[uVar15 * (long)iVar6 + ptr[uVar11 + 1]] + auVar42._8_8_;
                auVar42._0_8_ = auVar52._8_8_;
                auVar42._8_8_ = ptr_00[uVar11 + 1];
                auVar41._0_8_ = auVar42._0_8_ - uVar2;
                auVar41._8_8_ = ptr_00[uVar11 + 1] - uVar2;
                auVar48._0_8_ = auVar49._8_8_ - (ulong)(uint)uVar4;
                auVar48._8_8_ = ptr_01[uVar11 + 1] - (ulong)(uint)uVar4;
                auVar51._0_8_ = auVar52._0_8_ - uVar2;
                auVar51._8_8_ = auVar42._0_8_ - uVar2;
                auVar49._0_8_ = -(ulong)(auVar48._0_8_ < auVar41._0_8_);
                auVar49._8_8_ = -(ulong)(auVar48._8_8_ < auVar41._8_8_);
                auVar49 = blendvpd(auVar48,auVar41,auVar49);
                auVar40._0_8_ = auVar35._0_8_ - (ulong)(uint)uVar4;
                auVar40._8_8_ = auVar35._8_8_ - (ulong)(uint)uVar4;
                auVar52._0_8_ = -(ulong)(auVar40._0_8_ < auVar51._0_8_);
                auVar52._8_8_ = -(ulong)(auVar40._8_8_ < auVar51._8_8_);
                auVar41 = blendvpd(auVar40,auVar51,auVar52);
                auVar32._0_8_ = -(ulong)(auVar41._0_8_ < auVar31._0_8_);
                auVar32._8_8_ = -(ulong)(auVar41._8_8_ < auVar31._8_8_);
                auVar35 = blendvpd(auVar41,auVar31,auVar32);
                auVar24._0_8_ = -(ulong)(auVar49._0_8_ < auVar35._0_8_);
                auVar24._8_8_ = -(ulong)(auVar49._8_8_ < auVar35._8_8_);
                auVar32 = blendvpd(auVar49,auVar35,auVar24);
                auVar36._0_8_ = -(ulong)(0 < auVar32._0_8_);
                auVar36._8_8_ = -(ulong)(0 < auVar32._8_8_);
                lVar21 = in_XMM6._0_8_;
                lVar30 = in_XMM6._8_8_;
                auVar25._0_8_ = -(ulong)(lVar21 == auVar44._0_8_);
                auVar25._8_8_ = -(ulong)(lVar30 == auVar44._8_8_);
                auVar52 = ~auVar25 & auVar36 & auVar32;
                auVar49 = blendvpd(auVar49,auVar22,auVar25);
                auVar35 = blendvpd(auVar41,auVar22,auVar25);
                lVar50 = auVar52._0_8_;
                lVar53 = auVar52._8_8_;
                if (1 < uVar11) {
                  auVar26._0_8_ = -(ulong)(local_108._0_8_ < lVar50);
                  auVar26._8_8_ = -(ulong)(local_108._8_8_ < lVar53);
                  local_108 = blendvpd(auVar52,local_108,auVar26);
                  auVar27._0_8_ = -(ulong)(lVar50 < local_118._0_8_);
                  auVar27._8_8_ = -(ulong)(lVar53 < local_118._8_8_);
                  local_118 = blendvpd(auVar52,local_118,auVar27);
                }
                piVar1 = ((ppVar7->field_4).rowcols)->score_row;
                if (uVar11 < uVar20) {
                  *(int *)((long)piVar1 + uVar11 * 4 + lVar16) = auVar52._8_4_;
                }
                if (uVar11 != 0 && (long)(uVar13 | 1) < lVar19) {
                  *(int *)((long)piVar1 + uVar11 * 4 + local_e0) = auVar52._0_4_;
                }
                ptr_00[uVar11] = lVar50;
                auVar47._0_8_ = -(ulong)(auVar44._0_8_ < lVar21);
                auVar47._8_8_ = -(ulong)(auVar44._8_8_ < lVar30);
                auVar46._0_8_ = -(ulong)(lVar21 < (long)local_c8._0_8_);
                auVar46._8_8_ = -(ulong)(lVar30 < (long)local_c8._8_8_);
                auVar3._8_8_ = -(ulong)((long)local_138._8_8_ < (long)local_58._8_8_);
                auVar3._0_8_ = -(ulong)((long)local_138._0_8_ < (long)local_58._0_8_);
                auVar47 = auVar46 & auVar3 & auVar47;
                auVar45._0_8_ = -(ulong)(lVar50 == local_78._0_8_);
                auVar45._8_8_ = -(ulong)(lVar53 == local_78._8_8_);
                auVar43._0_8_ = -(ulong)(local_78._0_8_ < lVar50);
                auVar43._8_8_ = -(ulong)(local_78._8_8_ < lVar53);
                local_78 = blendvpd(local_78,auVar36 & auVar32,auVar43 & auVar47);
                auVar37._0_8_ = -(ulong)(lVar21 < local_a8._0_8_);
                auVar37._8_8_ = -(ulong)(lVar30 < local_a8._8_8_);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar32 = blendvpd(auVar43 & auVar47,auVar47,auVar37 & auVar45);
                local_d8 = blendvpd(local_d8,local_138,auVar32);
                local_a8 = blendvpd(local_a8,in_XMM6,(auVar37 & auVar45 | auVar43) & auVar47);
                ptr_01[uVar11] = auVar49._0_8_;
                in_XMM6._0_8_ = lVar21 + 1;
                in_XMM6._8_8_ = lVar30 - auVar44._8_8_;
                uVar11 = uVar11 + 1;
              } while (s2Len + 1 != uVar11);
              local_138._8_8_ = local_138._8_8_ + 2;
              local_138._0_8_ = local_138._0_8_ + 2;
              uVar13 = uVar13 + 2;
              lVar16 = lVar16 + local_90;
              local_e0 = local_e0 + local_90;
            } while ((long)uVar13 < lVar19);
            auVar22 = local_118;
            local_c8 = auVar23;
            local_58 = auVar28;
          }
          lVar19 = 0;
          iVar6 = 0;
          iVar9 = 0;
          bVar5 = true;
          do {
            bVar14 = bVar5;
            lVar16 = *(long *)(local_78 + lVar19);
            if (lVar17 < lVar16) {
              iVar6 = *(int *)(local_d8 + lVar19);
              lVar17 = lVar16;
              iVar9 = *(int *)(local_a8 + lVar19);
            }
            else if (lVar16 == lVar17) {
              lVar16 = *(long *)(local_a8 + lVar19);
              if (lVar16 < iVar9) {
                iVar6 = *(int *)(local_d8 + lVar19);
                iVar9 = (int)lVar16;
              }
              else if ((lVar16 == iVar9) && (*(long *)(local_d8 + lVar19) < (long)iVar6)) {
                iVar6 = (int)*(long *)(local_d8 + lVar19);
                iVar9 = (int)lVar16;
              }
            }
            lVar19 = lVar19 + 8;
            bVar5 = false;
          } while (bVar14);
          auVar28._8_4_ = (int)local_98;
          auVar28._0_8_ = local_98;
          auVar28._12_4_ = (int)(local_98 >> 0x20);
          auVar38._0_8_ = -(ulong)((long)local_98 < local_108._0_8_);
          auVar38._8_8_ = -(ulong)(auVar28._8_8_ < local_108._8_8_);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar33._8_4_ = (int)lVar18;
          auVar33._0_8_ = lVar18;
          auVar33._12_4_ = uVar34;
          auVar39._0_8_ = -(ulong)(lVar18 < auVar22._0_8_);
          auVar39._8_8_ = -(ulong)(auVar33._8_8_ < auVar22._8_8_);
          iVar12 = movmskpd((int)lVar19,auVar39 | auVar29 ^ auVar38);
          if (iVar12 != 0) {
            *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
            lVar17 = 0;
            iVar9 = 0;
            iVar6 = 0;
          }
          ppVar7->score = (int)lVar17;
          ppVar7->end_query = iVar6;
          ppVar7->end_ref = iVar9;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_140);
            return ppVar7;
          }
          return ppVar7;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}